

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirtyudp.h
# Opt level: O3

void __thiscall
UdpReceiver::Loop(UdpReceiver *this,_func_void_char_ptr_int_void_ptr *udpCallback,void *data)

{
  ushort uVar1;
  in_addr __in;
  in_addr_t iVar2;
  int iVar3;
  ssize_t sVar4;
  hostent *phVar5;
  char *pcVar6;
  void *pvVar7;
  undefined4 extraout_EDX;
  int extraout_EDX_00;
  char *pcVar8;
  in_addr *__addr;
  UdpSender *pUVar9;
  UdpReceiver *this_00;
  anon_class_16_2_8a47e332_for_handler_ aStack_60;
  UdpSender *pUStack_50;
  UdpReceiver *pUStack_48;
  
  memset(this->buffer,0,(long)this->bufferSize);
  __addr = (in_addr *)(ulong)(uint)this->socketFile;
  pcVar8 = this->buffer;
  iVar3 = 0;
  sVar4 = recvfrom(this->socketFile,pcVar8,(long)this->bufferSize,0,(sockaddr *)&this->clientAddress
                   ,&this->clientLength);
  if ((int)sVar4 < 0) {
    Loop();
  }
  else {
    __addr = &(this->clientAddress).sin_addr;
    pcVar8 = (char *)0x4;
    phVar5 = gethostbyaddr(__addr,4,2);
    this->client = (hostent *)phVar5;
    if (phVar5 != (hostent *)0x0) {
      __in.s_addr = (this->clientAddress).sin_addr.s_addr;
      __addr = (in_addr *)(ulong)__in.s_addr;
      pcVar6 = inet_ntoa(__in);
      this->clientIP = pcVar6;
      if (pcVar6 != (char *)0x0) {
        (*udpCallback)(this->buffer,(int)sVar4,data);
        return;
      }
      goto LAB_00149ea6;
    }
  }
  Loop();
LAB_00149ea6:
  Loop();
  *(char **)(__addr + 6) = pcVar8;
  __addr[1] = (in_addr)extraout_EDX;
  __addr[2] = (in_addr)iVar3;
  pvVar7 = calloc((long)iVar3,1);
  *(void **)(__addr + 4) = pvVar7;
  pUVar9 = (UdpSender *)0x2;
  iVar3 = 2;
  iVar2 = socket(2,2,0);
  __addr->s_addr = iVar2;
  if ((int)iVar2 < 0) {
    UdpSender::UdpSender(pUVar9);
  }
  else {
    phVar5 = gethostbyname(*(char **)(__addr + 6));
    *(hostent **)(__addr + 0xc) = phVar5;
    if (phVar5 != (hostent *)0x0) {
      *(undefined8 *)(__addr + 8) = 0;
      *(undefined8 *)(__addr + 10) = 0;
      *(undefined2 *)(__addr + 8) = 2;
      memmove(__addr + 9,*phVar5->h_addr_list,(long)phVar5->h_length);
      *(ushort *)((long)(__addr + 8) + 2) =
           *(ushort *)(__addr + 1) << 8 | *(ushort *)(__addr + 1) >> 8;
      return;
    }
  }
  pUVar9 = (UdpSender *)(__addr + 6);
  UdpSender::UdpSender(pUVar9);
  pUVar9->port = iVar3;
  pUVar9->bufferSize = extraout_EDX_00;
  pcVar8 = (char *)calloc((long)extraout_EDX_00,1);
  pUVar9->buffer = pcVar8;
  this_00 = (UdpReceiver *)0x2;
  iVar3 = socket(2,2,0);
  pUVar9->socketFile = iVar3;
  if (iVar3 < 0) {
    UdpReceiver(this_00);
  }
  else {
    *(undefined4 *)&pUVar9->field_0xc = 1;
    setsockopt(iVar3,1,6,&pUVar9->field_0xc,4);
    (pUVar9->serverAddress).sin_zero[0] = '\0';
    (pUVar9->serverAddress).sin_zero[1] = '\0';
    (pUVar9->serverAddress).sin_zero[2] = '\0';
    (pUVar9->serverAddress).sin_zero[3] = '\0';
    (pUVar9->serverAddress).sin_zero[4] = '\0';
    (pUVar9->serverAddress).sin_zero[5] = '\0';
    (pUVar9->serverAddress).sin_zero[6] = '\0';
    (pUVar9->serverAddress).sin_zero[7] = '\0';
    (pUVar9->serverAddress).sin_family = 2;
    (pUVar9->serverAddress).sin_addr.s_addr = 0;
    uVar1 = (ushort)pUVar9->port;
    (pUVar9->serverAddress).sin_port = uVar1 << 8 | uVar1 >> 8;
    this_00 = (UdpReceiver *)(ulong)(uint)pUVar9->socketFile;
    iVar3 = bind(pUVar9->socketFile,(sockaddr *)&pUVar9->serverAddress,0x10);
    if (-1 < iVar3) {
      *(undefined4 *)&pUVar9[1].buffer = 0x10;
      return;
    }
  }
  UdpReceiver(this_00);
  *(undefined1 *)&this_00->socketFile = 1;
  pUStack_50 = pUVar9;
  pUStack_48 = this;
  ableton::Link::Link((Link *)&this_00->bufferSize,120.0);
  LOCK();
  iVar3 = this_00[5].socketFile;
  *(undefined1 *)&this_00[5].socketFile = 1;
  UNLOCK();
  if ((iVar3 & 1) == 0) {
    aStack_60.this =
         (Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
          *)this_00[1].serverAddress.sin_zero;
    aStack_60.bEnable = true;
    asio::io_context::
    post<ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::enable(bool)::_lambda()_1_>
              (*(io_context **)&this_00[5].bufferSize,&aStack_60);
  }
  this_00[0x11].clientIP = (char *)0x4010000000000000;
  return;
}

Assistant:

void Loop(void (*udpCallback)(char* packet, int packetSize, void* data), void* data) {
      int packetSize;
      bzero(this->buffer, this->bufferSize*sizeof(char));
      packetSize = recvfrom(  this->socketFile,
                              this->buffer,
                              this->bufferSize,
                              0,
                              (struct sockaddr *)&this->clientAddress,
                              &this->clientLength);
      if(packetSize < 0)
        error("ERROR: There was a problem receiving data from a client");
      this->client = gethostbyaddr( (const char*)&this->clientAddress.sin_addr.s_addr,
                                    sizeof(this->clientAddress.sin_addr.s_addr),
                                    AF_INET);
      if(this->client == NULL)
        error("ERROR: Error getting client host info");
      this->clientIP = inet_ntoa(this->clientAddress.sin_addr);
      if(this->clientIP == NULL)
        error("ERROR: Error getting client IP.");
      // ----------------------------- //
      // --- Some old info logging --- //
      // ----------------------------- //
      /*
      printf("Received datagram from %s (%s):\n",
              this->client->h_name,
              this->clientIP);
      for(int i=0; i<strlen(this->buffer)&&i<this->bufferSize; i++)
        printf("%c", this->buffer[i]);
      printf("\n");
      */
      udpCallback(this->buffer, packetSize, data);
    }